

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSC32.h
# Opt level: O2

int GetPWMSSC32(SSC32 *pSSC32,int channel,int *pPw)

{
  int iVar1;
  size_t sVar2;
  char *__s;
  char recvbuf [2];
  char sendbuf [512];
  
  memset(sendbuf,0,0x200);
  sprintf(sendbuf,"#%dPI\r",channel);
  sVar2 = strlen(sendbuf);
  iVar1 = WriteDataSSC32(pSSC32,(uint8 *)sendbuf,(int)sVar2,pSSC32->bytedelayus);
  if (iVar1 == 0) {
    if ((pSSC32->bSaveRawData != 0) && ((FILE *)pSSC32->pfSaveFile != (FILE *)0x0)) {
      fwrite(sendbuf,(long)(int)sVar2,1,(FILE *)pSSC32->pfSaveFile);
      fflush((FILE *)pSSC32->pfSaveFile);
    }
    recvbuf[0] = '\0';
    recvbuf[1] = '\0';
    iVar1 = ReadAllRS232Port(&pSSC32->RS232Port,(uint8 *)recvbuf,2);
    if (iVar1 == 0) {
      if ((pSSC32->bSaveRawData != 0) && ((FILE *)pSSC32->pfSaveFile != (FILE *)0x0)) {
        fwrite(recvbuf,2,1,(FILE *)pSSC32->pfSaveFile);
        fflush((FILE *)pSSC32->pfSaveFile);
      }
      *pPw = (uint)(ushort)recvbuf;
      return 0;
    }
    __s = "Error reading data from a SSC32. ";
  }
  else {
    __s = "Error writing data to a SSC32. ";
  }
  puts(__s);
  return 1;
}

Assistant:

inline int GetPWMSSC32(SSC32* pSSC32, int channel, int* pPw)
{
	char sendbuf[MAX_NB_BYTES_SSC32];
	int sendbuflen = 0;
	char recvbuf[2];
	int recvbuflen = 0;
	unsigned short pw = 0;

	// Prepare data to send to device.
	memset(sendbuf, 0, sizeof(sendbuf));
	sprintf(sendbuf, "#%dPI\r", channel);
	sendbuflen = (int)strlen(sendbuf);

	if (WriteDataSSC32(pSSC32, (unsigned char*)sendbuf, sendbuflen, pSSC32->bytedelayus) != EXIT_SUCCESS)
	{
		printf("Error writing data to a SSC32. \n");
		return EXIT_FAILURE;
	}
	if ((pSSC32->bSaveRawData)&&(pSSC32->pfSaveFile))
	{
		fwrite(sendbuf, sendbuflen, 1, pSSC32->pfSaveFile);
		fflush(pSSC32->pfSaveFile);
	}
	
	// Prepare the buffers.
	memset(recvbuf, 0, sizeof(recvbuf));
	recvbuflen = 2;

	if (ReadAllRS232Port(&pSSC32->RS232Port, (unsigned char*)recvbuf, recvbuflen) != EXIT_SUCCESS)
	{
		printf("Error reading data from a SSC32. \n");
		return EXIT_FAILURE;
	}
	if ((pSSC32->bSaveRawData)&&(pSSC32->pfSaveFile))
	{
		fwrite(recvbuf, recvbuflen, 1, pSSC32->pfSaveFile);
		fflush(pSSC32->pfSaveFile);
	}

	// pw in us as a 16 bit integer.
	memcpy((char*)&pw, recvbuf, sizeof(unsigned short));
	*pPw = pw;

	return EXIT_SUCCESS;
}